

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void * worker_thread(void *thread_func_param)

{
  _union_1457 local_a8;
  sigaction sa;
  void *thread_func_param_local;
  
  sa.sa_restorer = (_func_void *)thread_func_param;
  memset(&local_a8,0,0x98);
  local_a8 = (_union_1457)0x1;
  sigaction(0xd,(sigaction *)&local_a8,(sigaction *)0x0);
  worker_thread_run((mg_connection *)sa.sa_restorer);
  return (void *)0x0;
}

Assistant:

static void *
worker_thread(void *thread_func_param)
{
#if !defined(__ZEPHYR__)
	struct sigaction sa;

	/* Ignore SIGPIPE */
	memset(&sa, 0, sizeof(sa));
	sa.sa_handler = SIG_IGN;
	sigaction(SIGPIPE, &sa, NULL);
#endif

	worker_thread_run((struct mg_connection *)thread_func_param);
	return NULL;
}